

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ForwardTypeRestrictionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForwardTypeRestrictionSyntax,slang::syntax::ForwardTypeRestrictionSyntax_const&>
          (BumpAllocator *this,ForwardTypeRestrictionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  ForwardTypeRestrictionSyntax *pFVar13;
  
  pFVar13 = (ForwardTypeRestrictionSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar5 = (args->keyword1).kind;
  uVar6 = (args->keyword1).field_0x2;
  NVar7.raw = (args->keyword1).numFlags.raw;
  uVar8 = (args->keyword1).rawLen;
  pIVar3 = (args->keyword1).info;
  TVar9 = (args->keyword2).kind;
  uVar10 = (args->keyword2).field_0x2;
  NVar11.raw = (args->keyword2).numFlags.raw;
  uVar12 = (args->keyword2).rawLen;
  (pFVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pFVar13->super_SyntaxNode).field_0x4 = uVar4;
  (pFVar13->super_SyntaxNode).parent = pSVar1;
  (pFVar13->super_SyntaxNode).previewNode = pSVar2;
  (pFVar13->keyword1).kind = TVar5;
  (pFVar13->keyword1).field_0x2 = uVar6;
  (pFVar13->keyword1).numFlags = (NumericTokenFlags)NVar7.raw;
  (pFVar13->keyword1).rawLen = uVar8;
  (pFVar13->keyword1).info = pIVar3;
  (pFVar13->keyword2).kind = TVar9;
  (pFVar13->keyword2).field_0x2 = uVar10;
  (pFVar13->keyword2).numFlags = (NumericTokenFlags)NVar11.raw;
  (pFVar13->keyword2).rawLen = uVar12;
  (pFVar13->keyword2).info = (args->keyword2).info;
  return pFVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }